

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O0

bool __thiscall
diy::
concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
::empty(concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
        *this)

{
  byte bVar1;
  mutex_type *in_RDI;
  lock_guard<fast_mutex> l;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  Catch::clara::std::unique_lock<tthread::fast_mutex>::unique_lock
            ((unique_lock<tthread::fast_mutex> *)
             CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),in_RDI);
  bVar1 = Catch::clara::std::
          map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
          ::empty((map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
                   *)0x205489);
  Catch::clara::std::unique_lock<tthread::fast_mutex>::~unique_lock
            ((unique_lock<tthread::fast_mutex> *)CONCAT17(bVar1,in_stack_ffffffffffffffe0));
  return (bool)(bVar1 & 1);
}

Assistant:

bool            empty()                 { lock_guard<fast_mutex> l(mutex_); return map_.empty(); }